

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_get_sent(char **trans)

{
  char **trans_local;
  
  if (transcription_fp == (FILE *)0x0) {
    trans_local._4_4_ = corpus_read_next_sent_file(trans);
  }
  else {
    trans_local._4_4_ = corpus_read_next_transcription_line(trans);
  }
  return trans_local._4_4_;
}

Assistant:

int
corpus_get_sent(char **trans)
{
  if (transcription_fp == NULL)
    return corpus_read_next_sent_file(trans);
  else
    return corpus_read_next_transcription_line(trans);
}